

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

double CEDate::CurrentJD(void)

{
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *this;
  double dVar1;
  vector<double,_std::allocator<double>_> date_info;
  tm current_jd;
  time_t now;
  vector<double,_std::allocator<double>_> *this_00;
  allocator_type *in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff70;
  tm local_40;
  time_t local_8;
  
  time(&local_8);
  gmtime_r(&local_8,&local_40);
  __x = (vector<double,_std::allocator<double>_> *)((double)local_40.tm_year + 1900.0);
  this = (vector<double,_std::allocator<double>_> *)((double)local_40.tm_mon + 1.0);
  CETime::CurrentUTC();
  this_00 = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff77;
  std::allocator<double>::allocator((allocator<double> *)0x135819);
  __l._M_len = in_stack_ffffffffffffff70;
  __l._M_array = (iterator)in_stack_ffffffffffffff68;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff60,__l,in_stack_ffffffffffffff58);
  std::allocator<double>::~allocator((allocator<double> *)0x135841);
  std::vector<double,_std::allocator<double>_>::vector(this,__x);
  dVar1 = GregorianVect2JD(in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return dVar1;
}

Assistant:

double CEDate::CurrentJD()
{
    // Get the current date information
    time_t now ;
    time (&now) ;
    struct tm current_jd;
    gmtime_r(&now, &current_jd) ;
    
    // Put this into a vector
    std::vector<double> date_info = {current_jd.tm_year+1900.0,
                                     current_jd.tm_mon+1.0,
                                     current_jd.tm_mday*1.0,
                                     CETime::CurrentUTC()/DAYSEC} ;
    
    // Convert the Gregorian date information into a Julian date
    return GregorianVect2JD( date_info ) ;
}